

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O2

int64_t get_satd(AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  undefined7 in_register_00000031;
  long lVar4;
  int row;
  int col;
  int iVar5;
  int iVar6;
  
  uVar1 = CONCAT71(in_register_00000031,bsize) & 0xffffffff;
  iVar2 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar1]
          + mi_row;
  iVar6 = 0;
  lVar4 = 0;
  for (; iVar5 = mi_col, mi_row < iVar2; mi_row = mi_row + uVar3) {
    for (; uVar3 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                         [cpi->weber_bsize],
        iVar5 < (int)((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                            [uVar1] + mi_col); iVar5 = iVar5 + uVar3) {
      if ((mi_row < (cpi->common).mi_params.mi_rows) && (iVar5 < (cpi->common).mi_params.mi_cols)) {
        lVar4 = lVar4 + cpi->mb_weber_stats
                        [iVar5 / (int)uVar3 + (mi_row / (int)uVar3) * (cpi->frame_info).mi_cols].
                        satd;
        iVar6 = iVar6 + 1;
      }
    }
  }
  if (iVar6 != 0) {
    lVar4 = (long)(int)(lVar4 / (long)iVar6);
  }
  iVar2 = 1;
  if (1 < lVar4) {
    iVar2 = (int)lVar4;
  }
  return (long)iVar2;
}

Assistant:

static int64_t get_satd(AV1_COMP *const cpi, BLOCK_SIZE bsize, int mi_row,
                        int mi_col) {
  AV1_COMMON *const cm = &cpi->common;
  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];

  const int mi_step = mi_size_wide[cpi->weber_bsize];
  int mb_stride = cpi->frame_info.mi_cols;
  int mb_count = 0;
  int64_t satd = 0;

  for (int row = mi_row; row < mi_row + mi_high; row += mi_step) {
    for (int col = mi_col; col < mi_col + mi_wide; col += mi_step) {
      if (row >= cm->mi_params.mi_rows || col >= cm->mi_params.mi_cols)
        continue;

      satd += cpi->mb_weber_stats[(row / mi_step) * mb_stride + (col / mi_step)]
                  .satd;
      ++mb_count;
    }
  }

  if (mb_count) satd = (int)(satd / mb_count);
  satd = AOMMAX(1, satd);

  return (int)satd;
}